

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::CopyImageTest::destroyImagesIter(CopyImageTest *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  ObjectWrapper *pOVar3;
  State *pSVar4;
  pointer pAVar5;
  pointer pAVar6;
  ArrayBuffer<unsigned_char,_1UL,_1UL> *pAVar7;
  ArrayBuffer<unsigned_char,_1UL,_1UL> *pAVar8;
  ArrayBuffer<unsigned_char,_1UL,_1UL> *this_00;
  pointer this_01;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Deleting source image. ",0x17);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  pOVar3 = this->m_state->srcImage;
  if (pOVar3 != (ObjectWrapper *)0x0) {
    glu::ObjectWrapper::~ObjectWrapper(pOVar3);
  }
  operator_delete(pOVar3,0x18);
  pSVar4 = this->m_state;
  pSVar4->srcImage = (ObjectWrapper *)0x0;
  pAVar5 = (pSVar4->srcImageLevels).
           super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar6 = (pSVar4->srcImageLevels).
           super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_01 = pAVar5;
  if (pAVar6 != pAVar5) {
    do {
      de::ArrayBuffer<unsigned_char,_1UL,_1UL>::clear(this_01);
      this_01 = this_01 + 1;
    } while (this_01 != pAVar6);
    (pSVar4->srcImageLevels).
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pAVar5;
  }
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Deleting destination image. ",0x1c);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  pOVar3 = this->m_state->dstImage;
  if (pOVar3 != (ObjectWrapper *)0x0) {
    glu::ObjectWrapper::~ObjectWrapper(pOVar3);
  }
  operator_delete(pOVar3,0x18);
  pSVar4 = this->m_state;
  pSVar4->dstImage = (ObjectWrapper *)0x0;
  pAVar7 = (pSVar4->dstImageLevels).
           super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar8 = (pSVar4->dstImageLevels).
           super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = pAVar7;
  if (pAVar8 != pAVar7) {
    do {
      de::ArrayBuffer<unsigned_char,_1UL,_1UL>::clear(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pAVar8);
    (pSVar4->dstImageLevels).
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pAVar7;
  }
  return;
}

Assistant:

void CopyImageTest::destroyImagesIter (void)
{
	TestLog& log = m_testCtx.getLog();

	log << TestLog::Message << "Deleting source image. " << TestLog::EndMessage;

	delete m_state->srcImage;
	m_state->srcImage = NULL;
	m_state->srcImageLevels.clear();

	log << TestLog::Message << "Deleting destination image. " << TestLog::EndMessage;

	delete m_state->dstImage;
	m_state->dstImage = NULL;
	m_state->dstImageLevels.clear();
}